

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

void SDL_GL_UpdateRects(int numrects,SDL12_Rect *rects12)

{
  SDL12_Rect SVar1;
  byte bVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  GLenum GVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  SDL_Rect intersected20;
  SDL_Rect local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  SDL_Rect local_48;
  
  if (OpenGLBlitTexture != 0) {
    uVar10 = (ulong)VideoSurface12Location.pitch;
    bVar2 = (VideoSurface12Location.format)->BytesPerPixel;
    GVar11 = 0x8363;
    if (bVar2 == 4) {
      GVar11 = 0x1401;
    }
    local_78.x = 0;
    local_78.y = 0;
    local_78.h = VideoSurface12Location.h;
    local_78.w = VideoSurface12Location.w;
    if (0 < numrects) {
      uVar8 = 0;
      do {
        SVar1 = rects12[uVar8];
        auVar12._8_8_ = 0;
        auVar12._0_2_ = SVar1.x;
        auVar12._2_2_ = SVar1.y;
        auVar12._4_2_ = SVar1.w;
        auVar12._6_2_ = SVar1.h;
        auVar14 = pshuflw(in_XMM1,auVar12,0x60);
        local_48.x = auVar14._0_4_ >> 0x10;
        local_48.y = auVar14._4_4_ >> 0x10;
        auVar3._8_4_ = 0;
        auVar3._0_2_ = SVar1.x;
        auVar3._2_2_ = SVar1.y;
        auVar3._4_2_ = SVar1.w;
        auVar3._6_2_ = SVar1.h;
        auVar3._12_2_ = SVar1.h;
        auVar4._8_2_ = SVar1.w;
        auVar4._0_2_ = SVar1.x;
        auVar4._2_2_ = SVar1.y;
        auVar4._4_2_ = SVar1.w;
        auVar4._6_2_ = SVar1.h;
        auVar4._10_4_ = auVar3._10_4_;
        local_48._8_8_ = ZEXT68(auVar4._8_6_);
        (*SDL20_IntersectRect)(&local_48,&local_78,&intersected20);
        (*OpenGLFuncs.glTexSubImage2D)
                  (0xde1,0,intersected20.x,intersected20.y,intersected20.w,intersected20.h,
                   (bVar2 == 4) + 0x1907,GVar11,
                   (GLvoid *)
                   ((long)VideoSurface12Location.pixels +
                   (long)(int)(intersected20.x * (uint)bVar2) + (long)intersected20.y * uVar10));
        (*OpenGLFuncs.glBegin)(5);
        iVar6 = intersected20.y;
        iVar5 = intersected20.x;
        auVar13._0_4_ = (float)VideoSurface12Location.w;
        fVar18 = (float)VideoSurface12Location.h;
        auVar16._0_4_ = (float)intersected20.x;
        auVar16._4_4_ = (float)intersected20.w;
        auVar16._8_8_ = 0;
        auVar13._4_4_ = auVar13._0_4_;
        auVar13._8_4_ = auVar13._0_4_;
        auVar13._12_4_ = auVar13._0_4_;
        local_58 = divps(auVar16,auVar13);
        fVar17 = local_58._4_4_ + local_58._0_4_;
        auVar15._0_4_ = (float)intersected20.y;
        auVar15._4_4_ = (float)intersected20.h;
        auVar15._8_8_ = 0;
        auVar14._4_4_ = fVar18;
        auVar14._0_4_ = fVar18;
        auVar14._8_4_ = fVar18;
        auVar14._12_4_ = fVar18;
        local_68 = divps(auVar15,auVar14);
        fVar18 = local_68._4_4_ + local_68._0_4_;
        iVar7 = intersected20.w + intersected20.x;
        iVar9 = intersected20.h + intersected20.y;
        (*OpenGLFuncs.glTexCoord2f)(local_58._0_4_,local_68._0_4_);
        (*OpenGLFuncs.glVertex2i)(iVar5,iVar6);
        (*OpenGLFuncs.glTexCoord2f)(fVar17,(GLfloat)local_68._0_4_);
        (*OpenGLFuncs.glVertex2i)(iVar7,iVar6);
        (*OpenGLFuncs.glTexCoord2f)((GLfloat)local_58._0_4_,fVar18);
        (*OpenGLFuncs.glVertex2i)(iVar5,iVar9);
        (*OpenGLFuncs.glTexCoord2f)(fVar17,fVar18);
        (*OpenGLFuncs.glVertex2i)(iVar7,iVar9);
        (*OpenGLFuncs.glEnd)();
        in_XMM1._8_8_ = extraout_XMM1_Qb;
        in_XMM1._0_8_ = extraout_XMM1_Qa;
        uVar8 = uVar8 + 1;
      } while ((uint)numrects != uVar8);
    }
  }
  return;
}

Assistant:

SDLCALL
SDL_GL_UpdateRects(int numrects, SDL12_Rect *rects12)
{
    if (OpenGLBlitTexture) {
        const int srcpitch = VideoSurface12->pitch;
        const int pixsize = VideoSurface12->format->BytesPerPixel;
        const GLenum glfmt = (pixsize == 4) ? GL_RGBA : GL_RGB;
        const GLenum gltype = (pixsize == 4) ? GL_UNSIGNED_BYTE : GL_UNSIGNED_SHORT_5_6_5;
        SDL_Rect surfacerect20;
        int i;

        surfacerect20.x = surfacerect20.y = 0;
        surfacerect20.w = VideoSurface12->w;
        surfacerect20.h = VideoSurface12->h;

        for (i = 0; i < numrects; i++) {
            SDL_Rect rect20;
            SDL_Rect intersected20;
            Uint8 *src;

            SDL20_IntersectRect(Rect12to20(&rects12[i], &rect20), &surfacerect20, &intersected20);

            src = (((Uint8 *) VideoSurface12->pixels) + (intersected20.y * srcpitch)) + (intersected20.x * pixsize);
            OpenGLFuncs.glTexSubImage2D(GL_TEXTURE_2D, 0, intersected20.x, intersected20.y, intersected20.w, intersected20.h, glfmt, gltype, src);

            OpenGLFuncs.glBegin(GL_TRIANGLE_STRIP);
            {
                const GLfloat tex_x1 = ((GLfloat) intersected20.x) / ((GLfloat) VideoSurface12->w);
                const GLfloat tex_y1 = ((GLfloat) intersected20.y) / ((GLfloat) VideoSurface12->h);
                const GLfloat tex_x2 = tex_x1 + ((GLfloat) intersected20.w) / ((GLfloat) VideoSurface12->w);
                const GLfloat tex_y2 = tex_y1 + ((GLfloat) intersected20.h) / ((GLfloat) VideoSurface12->h);
                const GLint vert_x1 = (GLint) intersected20.x;
                const GLint vert_y1 = (GLint) intersected20.y;
                const GLint vert_x2 = vert_x1 + (GLint) intersected20.w;
                const GLint vert_y2 = vert_y1 + (GLint) intersected20.h;
                OpenGLFuncs.glTexCoord2f(tex_x1, tex_y1);
                OpenGLFuncs.glVertex2i(vert_x1, vert_y1);
                OpenGLFuncs.glTexCoord2f(tex_x2, tex_y1);
                OpenGLFuncs.glVertex2i(vert_x2, vert_y1);
                OpenGLFuncs.glTexCoord2f(tex_x1, tex_y2);
                OpenGLFuncs.glVertex2i(vert_x1, vert_y2);
                OpenGLFuncs.glTexCoord2f(tex_x2, tex_y2);
                OpenGLFuncs.glVertex2i(vert_x2, vert_y2);
            }
            OpenGLFuncs.glEnd();
        }
    }
}